

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O1

ON_UuidPtr * __thiscall ON_UuidPtrList::SearchHelper(ON_UuidPtrList *this,ON_UUID *uuid)

{
  uint uVar1;
  int iVar2;
  ON_UuidPtr *pOVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  if ((8 < (this->super_ON_SimpleArray<ON_UuidPtr>).m_count - this->m_sorted_count) ||
     (this->m_removed_count != 0)) {
    ImproveSearchSpeed(this);
  }
  if ((ulong)this->m_sorted_count == 0) {
    pOVar3 = (ON_UuidPtr *)0x0;
  }
  else {
    pOVar3 = (ON_UuidPtr *)
             bsearch(uuid,(this->super_ON_SimpleArray<ON_UuidPtr>).m_a,(ulong)this->m_sorted_count,
                     0x18,compar_uuidptr_uuid);
  }
  if (pOVar3 == (ON_UuidPtr *)0x0) {
    uVar1 = this->m_sorted_count;
    iVar2 = (this->super_ON_SimpleArray<ON_UuidPtr>).m_count;
    if ((int)uVar1 < iVar2) {
      pOVar3 = (this->super_ON_SimpleArray<ON_UuidPtr>).m_a + (int)uVar1;
      lVar4 = (long)iVar2 - (long)(int)uVar1;
      do {
        auVar5[0] = -((char)(pOVar3->m_id).Data1 == (char)uuid->Data1);
        auVar5[1] = -(*(char *)((long)&(pOVar3->m_id).Data1 + 1) ==
                     *(char *)((long)&uuid->Data1 + 1));
        auVar5[2] = -(*(char *)((long)&(pOVar3->m_id).Data1 + 2) ==
                     *(char *)((long)&uuid->Data1 + 2));
        auVar5[3] = -(*(char *)((long)&(pOVar3->m_id).Data1 + 3) ==
                     *(char *)((long)&uuid->Data1 + 3));
        auVar5[4] = -((char)(pOVar3->m_id).Data2 == (char)uuid->Data2);
        auVar5[5] = -(*(char *)((long)&(pOVar3->m_id).Data2 + 1) ==
                     *(char *)((long)&uuid->Data2 + 1));
        auVar5[6] = -((char)(pOVar3->m_id).Data3 == (char)uuid->Data3);
        auVar5[7] = -(*(char *)((long)&(pOVar3->m_id).Data3 + 1) ==
                     *(char *)((long)&uuid->Data3 + 1));
        auVar5[8] = -((pOVar3->m_id).Data4[0] == uuid->Data4[0]);
        auVar5[9] = -((pOVar3->m_id).Data4[1] == uuid->Data4[1]);
        auVar5[10] = -((pOVar3->m_id).Data4[2] == uuid->Data4[2]);
        auVar5[0xb] = -((pOVar3->m_id).Data4[3] == uuid->Data4[3]);
        auVar5[0xc] = -((pOVar3->m_id).Data4[4] == uuid->Data4[4]);
        auVar5[0xd] = -((pOVar3->m_id).Data4[5] == uuid->Data4[5]);
        auVar5[0xe] = -((pOVar3->m_id).Data4[6] == uuid->Data4[6]);
        auVar5[0xf] = -((pOVar3->m_id).Data4[7] == uuid->Data4[7]);
        if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
          return pOVar3;
        }
        pOVar3 = pOVar3 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    pOVar3 = (ON_UuidPtr *)0x0;
  }
  return pOVar3;
}

Assistant:

ON_UuidPtr* ON_UuidPtrList::SearchHelper(const ON_UUID* uuid) const
{
  if ( m_count - m_sorted_count > 8 || m_removed_count > 0 )
  {
    // time to resort the array so that the speedy
    // bsearch() can be used to find uuids
    const_cast<ON_UuidPtrList*>(this)->ImproveSearchSpeed();
  }

  ON_UuidPtr* p = (m_sorted_count > 0 )
                   ? (ON_UuidPtr*)bsearch( uuid, m_a, m_sorted_count, 
                                        sizeof(m_a[0]), 
                                        (int(*)(const void*,const void*))compar_uuidptr_uuid ) 
                   : 0;
  if (0 == p)
  {
    // do a slow search on the last m_count-m_sort_count elements
    // in the array.
    int i;
    for ( i = m_sorted_count; i < m_count; i++ )
    {
      if ( 0 == ON_UuidList::CompareUuid(uuid,&m_a[i].m_id) )
      {
        p = m_a+i;
        break;
      }
    }
  }

  return p;
}